

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  AppConfig config_00;
  int iVar1;
  ostream *poVar2;
  SceneInfo *this;
  char *pcVar3;
  Renderer *renderer;
  undefined1 local_500 [8];
  Application app;
  Viewer viewer;
  SceneInfo *sceneInfo;
  allocator<char> local_81;
  string local_80 [8];
  string sceneFilePath;
  undefined1 auStack_58 [4];
  int opt;
  AppConfig config;
  char **argv_local;
  int argc_local;
  
  config.pathtracer_envmap = (HDRImageBuffer *)argv;
  CMU462::AppConfig::AppConfig((AppConfig *)auStack_58);
  while (sceneFilePath.field_2._12_4_ = getopt(argc,(char **)config.pathtracer_envmap,"s:l:t:m:e:h")
        , sceneFilePath.field_2._12_4_ != -1) {
    switch(sceneFilePath.field_2._12_4_) {
    case 0x65:
      config.pathtracer_num_threads = (size_t)load_exr(optarg);
      break;
    default:
      usage((char *)(config.pathtracer_envmap)->w);
      return 1;
    case 0x6c:
      iVar1 = atoi(optarg);
      config.pathtracer_max_ray_depth = (size_t)iVar1;
      break;
    case 0x6d:
      iVar1 = atoi(optarg);
      config.pathtracer_ns_aa = (size_t)iVar1;
      break;
    case 0x73:
      iVar1 = atoi(optarg);
      _auStack_58 = (size_t)iVar1;
      break;
    case 0x74:
      iVar1 = atoi(optarg);
      config.pathtracer_ns_refr = (size_t)iVar1;
    }
  }
  if (argc <= optind) {
    usage((char *)(config.pathtracer_envmap)->w);
    return 1;
  }
  pcVar3 = (char *)(&(config.pathtracer_envmap)->w)[optind];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,pcVar3,&local_81);
  std::allocator<char>::~allocator(&local_81);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
  poVar2 = std::operator<<(poVar2,"Input scene file: ");
  poVar2 = std::operator<<(poVar2,local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (SceneInfo *)operator_new(0x18);
  (this->nodes).super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CMU462::Collada::SceneInfo::SceneInfo(this);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = CMU462::Collada::ColladaParser::load(pcVar3,this);
  if (-1 < iVar1) {
    CMU462::Viewer::Viewer((Viewer *)&app.field_0x457);
    config_00.pathtracer_max_ray_depth = config.pathtracer_ns_aa;
    config_00.pathtracer_ns_aa = _auStack_58;
    config_00.pathtracer_ns_area_light = config.pathtracer_max_ray_depth;
    config_00.pathtracer_ns_diff = config.pathtracer_ns_area_light;
    config_00.pathtracer_ns_glsy = config.pathtracer_ns_diff;
    config_00.pathtracer_ns_refr = config.pathtracer_ns_glsy;
    config_00.pathtracer_num_threads = config.pathtracer_ns_refr;
    config_00.pathtracer_envmap = (HDRImageBuffer *)config.pathtracer_num_threads;
    CMU462::Application::Application((Application *)local_500,config_00);
    renderer = (Renderer *)local_500;
    CMU462::Viewer::set_renderer((Viewer *)&app.field_0x457,renderer);
    CMU462::Viewer::init((Viewer *)&app.field_0x457,(EVP_PKEY_CTX *)renderer);
    CMU462::Application::load((Application *)local_500,this);
    if (this != (SceneInfo *)0x0) {
      CMU462::Collada::SceneInfo::~SceneInfo(this);
      operator_delete(this,0x18);
    }
    CMU462::Viewer::start((Viewer *)&app.field_0x457);
    exit(0);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
  poVar2 = std::operator<<(poVar2,"Error: parsing failed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (this != (SceneInfo *)0x0) {
    CMU462::Collada::SceneInfo::~SceneInfo(this);
    operator_delete(this,0x18);
  }
  exit(0);
}

Assistant:

int main( int argc, char** argv ) {

  // get the options
  AppConfig config; int opt;
  while ( (opt = getopt(argc, argv, "s:l:t:m:e:h")) != -1 ) {  // for each option...
    switch ( opt ) {
      case 's':
        config.pathtracer_ns_aa = atoi(optarg);
        break;
      case 'l':
        config.pathtracer_ns_area_light = atoi(optarg);
        break;
      case 't':
        config.pathtracer_num_threads = atoi(optarg);
        break;
      case 'm':
        config.pathtracer_max_ray_depth = atoi(optarg);
        break;
      case 'e':
        config.pathtracer_envmap = load_exr(optarg);
        break;
      default:
        usage(argv[0]);
        return 1;
    }
  }

  // print usage if no argument given
  if (optind >= argc) {
    usage(argv[0]);
    return 1;
  }

  string sceneFilePath = argv[optind];
  msg("Input scene file: " << sceneFilePath);

  // parse scene
  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(sceneFilePath.c_str(), sceneInfo) < 0)
  {
    msg( "Error: parsing failed!" );
    delete sceneInfo;
    exit(0);
  }

  // create viewer
  Viewer viewer = Viewer();

  // create application
  Application app (config);

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // load scene
  app.load(sceneInfo);


  delete sceneInfo;

  // NOTE (sky): are we copying everything to dynamic scene? If so:
  // TODO (sky): check and make sure the destructor is freeing everything

  // start viewer
  viewer.start();

  // TODO:
  // apparently the meshEdit renderer instance was not destroyed properly
  // not sure if this is due to the recent refactor but if anyone got some
  // free time, check the destructor for Application.
  exit(EXIT_SUCCESS); // shamelessly faking it

  return 0;

}